

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O0

void basist::encode_bc7_block(void *pBlock,bc7_optimization_results *pResults)

{
  byte bVar1;
  undefined1 uVar2;
  undefined4 uVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  uint32_t num_bits;
  uint *in_RSI;
  uint32_t *in_RDI;
  uint32_t n_1;
  int idx_1;
  uint32_t x_1;
  uint32_t y_1;
  uint32_t n;
  int idx;
  uint32_t x;
  uint32_t y;
  uint32_t subset_1;
  uint32_t subset;
  uint32_t comp;
  uint32_t total_comps;
  uint32_t cur_bit_ofs;
  uint8_t *pBlock_bytes;
  uint8_t t_2;
  uint32_t i_1;
  uint32_t num_alpha_indices;
  uint32_t alpha_index_bits;
  uint32_t t_1;
  color_quad_u8 tmp;
  uint8_t t;
  uint32_t q;
  uint32_t i;
  uint32_t num_color_indices;
  uint32_t color_index_bits;
  uint32_t anchor_index;
  uint32_t k;
  int anchor [3];
  uint32_t pbits [3] [2];
  color_quad_u8 high [3];
  color_quad_u8 low [3];
  uint8_t alpha_selectors [16];
  uint8_t color_selectors [16];
  uint8_t *pPartition;
  uint32_t total_partitions;
  uint32_t total_subsets;
  uint32_t best_mode;
  uint32_t *in_stack_fffffffffffffed0;
  uint32_t in_stack_fffffffffffffed8;
  uint32_t in_stack_fffffffffffffedc;
  uint32_t *in_stack_fffffffffffffee0;
  uint local_ec;
  uint local_e8;
  uint local_dc;
  uint local_d8;
  uint local_d4;
  uint local_d0;
  uint local_cc;
  uint local_b4;
  uint local_9c;
  uint local_98;
  uint local_8c;
  uint local_88;
  uint local_84 [3];
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  uint local_58;
  undefined8 local_54;
  uint local_4c;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined1 *local_28;
  uint local_1c;
  uint local_18;
  uint local_14;
  uint *local_10;
  uint32_t *local_8;
  
  local_14 = *in_RSI;
  local_18 = (uint)*(byte *)((long)&g_bc7_num_subsets + (ulong)local_14);
  local_1c = 1 << (*(byte *)((long)&g_bc7_partition_bits + (ulong)local_14) & 0x1f);
  if (local_18 == 1) {
    local_28 = g_bc7_partition1;
  }
  else if (local_18 == 2) {
    local_28 = g_bc7_partition2 + (in_RSI[1] << 4);
  }
  else {
    local_28 = g_bc7_partition3 + (in_RSI[1] << 4);
  }
  local_38 = *(undefined8 *)(in_RSI + 2);
  local_30 = *(undefined8 *)(in_RSI + 4);
  local_48 = *(undefined8 *)(in_RSI + 6);
  local_40 = *(undefined8 *)(in_RSI + 8);
  local_54 = *(undefined8 *)(in_RSI + 10);
  local_4c = in_RSI[0xc];
  local_60 = *(undefined8 *)(in_RSI + 0xd);
  local_58 = in_RSI[0xf];
  local_78 = *(undefined8 *)(in_RSI + 0x10);
  local_70 = *(undefined8 *)(in_RSI + 0x12);
  local_68 = *(undefined8 *)(in_RSI + 0x14);
  local_84[0] = 0xffffffff;
  local_84[1] = 0xffffffff;
  local_84[2] = 0xffffffff;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_88 = 0; local_88 < local_18; local_88 = local_88 + 1) {
    local_8c = 0;
    if (local_88 != 0) {
      if ((local_18 == 3) && (local_88 == 1)) {
        bVar1 = g_bc7_table_anchor_index_third_subset_1[local_10[1]];
      }
      else if ((local_18 == 3) && (local_88 == 2)) {
        bVar1 = g_bc7_table_anchor_index_third_subset_2[local_10[1]];
      }
      else {
        bVar1 = g_bc7_table_anchor_index_second_subset[local_10[1]];
      }
      local_8c = (uint)bVar1;
    }
    local_84[local_88] = local_8c;
    iVar5 = get_bc7_color_index_size(local_14,local_10[0x16]);
    uVar6 = 1 << ((byte)iVar5 & 0x1f);
    if (((uint)*(byte *)((long)&local_38 + (ulong)local_8c) & uVar6 >> 1) != 0) {
      for (local_98 = 0; local_98 < 0x10; local_98 = local_98 + 1) {
        if ((byte)local_28[local_98] == local_88) {
          *(char *)((long)&local_38 + (ulong)local_98) =
               ((char)uVar6 + -1) - *(char *)((long)&local_38 + (ulong)local_98);
        }
      }
      bVar4 = get_bc7_mode_has_seperate_alpha_selectors(local_14);
      if (bVar4) {
        for (local_9c = 0; local_9c < 3; local_9c = local_9c + 1) {
          uVar2 = *(undefined1 *)((long)&local_54 + (ulong)local_9c + (ulong)local_88 * 4);
          *(undefined1 *)((long)&local_54 + (ulong)local_9c + (ulong)local_88 * 4) =
               *(undefined1 *)((long)&local_60 + (ulong)local_9c + (ulong)local_88 * 4);
          *(undefined1 *)((long)&local_60 + (ulong)local_9c + (ulong)local_88 * 4) = uVar2;
        }
      }
      else {
        uVar3 = *(undefined4 *)((long)&local_54 + (ulong)local_88 * 4);
        *(undefined4 *)((long)&local_54 + (ulong)local_88 * 4) =
             *(undefined4 *)((long)&local_60 + (ulong)local_88 * 4);
        *(undefined4 *)((long)&local_60 + (ulong)local_88 * 4) = uVar3;
      }
      if (*(char *)((long)&g_bc7_mode_has_shared_p_bits + (ulong)local_14) == '\0') {
        uVar3 = *(undefined4 *)(&local_78 + local_88);
        *(undefined4 *)(&local_78 + local_88) =
             *(undefined4 *)((long)&local_78 + (ulong)local_88 * 8 + 4);
        *(undefined4 *)((long)&local_78 + (ulong)local_88 * 8 + 4) = uVar3;
      }
    }
    bVar4 = get_bc7_mode_has_seperate_alpha_selectors(local_14);
    if (bVar4) {
      iVar5 = get_bc7_alpha_index_size(local_14,local_10[0x16]);
      uVar6 = 1 << ((byte)iVar5 & 0x1f);
      if (((uint)*(byte *)((long)&local_48 + (ulong)local_8c) & uVar6 >> 1) != 0) {
        for (local_b4 = 0; local_b4 < 0x10; local_b4 = local_b4 + 1) {
          if ((byte)local_28[local_b4] == local_88) {
            *(char *)((long)&local_48 + (ulong)local_b4) =
                 ((char)uVar6 + -1) - *(char *)((long)&local_48 + (ulong)local_b4);
          }
        }
        uVar2 = *(undefined1 *)((long)&local_54 + (ulong)local_88 * 4 + 3);
        *(undefined1 *)((long)&local_54 + (ulong)local_88 * 4 + 3) =
             *(undefined1 *)((long)&local_60 + (ulong)local_88 * 4 + 3);
        *(undefined1 *)((long)&local_60 + (ulong)local_88 * 4 + 3) = uVar2;
      }
    }
  }
  memset(local_8,0,0x10);
  bc7_set_block_bits((uint8_t *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,
                     in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  if ((local_14 == 4) || (local_14 == 5)) {
    bc7_set_block_bits((uint8_t *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,
                       in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  }
  if (local_14 == 4) {
    bc7_set_block_bits((uint8_t *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,
                       in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  }
  if (1 < local_1c) {
    bc7_set_block_bits((uint8_t *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,
                       in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  }
  uVar6 = 3;
  if (3 < local_14) {
    uVar6 = 4;
  }
  for (local_cc = 0; local_cc < uVar6; local_cc = local_cc + 1) {
    for (local_d0 = 0; local_d0 < local_18; local_d0 = local_d0 + 1) {
      bc7_set_block_bits((uint8_t *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,
                         in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
      bc7_set_block_bits((uint8_t *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,
                         in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    }
  }
  if (*(char *)((long)&g_bc7_mode_has_p_bits + (ulong)local_14) != '\0') {
    for (local_d4 = 0; local_d4 < local_18; local_d4 = local_d4 + 1) {
      bc7_set_block_bits((uint8_t *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,
                         in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
      if (*(char *)((long)&g_bc7_mode_has_shared_p_bits + (ulong)local_14) == '\0') {
        bc7_set_block_bits((uint8_t *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,
                           in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
      }
    }
  }
  for (local_d8 = 0; local_d8 < 4; local_d8 = local_d8 + 1) {
    for (local_dc = 0; local_dc < 4; local_dc = local_dc + 1) {
      iVar5 = local_dc + local_d8 * 4;
      if (local_10[0x16] == 0) {
        get_bc7_color_index_size(local_14,local_10[0x16]);
      }
      else {
        get_bc7_alpha_index_size(local_14,local_10[0x16]);
      }
      if (local_10[0x16] == 0) {
        uVar2 = *(undefined1 *)((long)&local_38 + (long)iVar5);
      }
      else {
        uVar2 = *(undefined1 *)((long)&local_48 + (long)iVar5);
      }
      in_stack_fffffffffffffedc = CONCAT13(uVar2,(int3)in_stack_fffffffffffffedc);
      in_stack_fffffffffffffee0 = local_8;
      bc7_set_block_bits((uint8_t *)local_8,in_stack_fffffffffffffedc,in_stack_fffffffffffffed8,
                         in_stack_fffffffffffffed0);
    }
  }
  bVar4 = get_bc7_mode_has_seperate_alpha_selectors(local_14);
  if (bVar4) {
    for (local_e8 = 0; local_e8 < 4; local_e8 = local_e8 + 1) {
      for (local_ec = 0; local_ec < 4; local_ec = local_ec + 1) {
        if (local_10[0x16] == 0) {
          num_bits = get_bc7_alpha_index_size(local_14,local_10[0x16]);
        }
        else {
          num_bits = get_bc7_color_index_size(local_14,local_10[0x16]);
        }
        bc7_set_block_bits((uint8_t *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,num_bits,
                           local_8);
      }
    }
  }
  __assert_fail("cur_bit_ofs == 128",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                ,0x2da4,"void basist::encode_bc7_block(void *, const bc7_optimization_results *)");
}

Assistant:

void encode_bc7_block(void* pBlock, const bc7_optimization_results* pResults)
	{
		const uint32_t best_mode = pResults->m_mode;

		const uint32_t total_subsets = g_bc7_num_subsets[best_mode];
		const uint32_t total_partitions = 1 << g_bc7_partition_bits[best_mode];
		//const uint32_t num_rotations = 1 << g_bc7_rotation_bits[best_mode];
		//const uint32_t num_index_selectors = (best_mode == 4) ? 2 : 1;

		const uint8_t* pPartition;
		if (total_subsets == 1)
			pPartition = &g_bc7_partition1[0];
		else if (total_subsets == 2)
			pPartition = &g_bc7_partition2[pResults->m_partition * 16];
		else
			pPartition = &g_bc7_partition3[pResults->m_partition * 16];

		uint8_t color_selectors[16];
		memcpy(color_selectors, pResults->m_selectors, 16);

		uint8_t alpha_selectors[16];
		memcpy(alpha_selectors, pResults->m_alpha_selectors, 16);

		color_quad_u8 low[3], high[3];
		memcpy(low, pResults->m_low, sizeof(low));
		memcpy(high, pResults->m_high, sizeof(high));

		uint32_t pbits[3][2];
		memcpy(pbits, pResults->m_pbits, sizeof(pbits));

		int anchor[3] = { -1, -1, -1 };

		for (uint32_t k = 0; k < total_subsets; k++)
		{
			uint32_t anchor_index = 0;
			if (k)
			{
				if ((total_subsets == 3) && (k == 1))
					anchor_index = g_bc7_table_anchor_index_third_subset_1[pResults->m_partition];
				else if ((total_subsets == 3) && (k == 2))
					anchor_index = g_bc7_table_anchor_index_third_subset_2[pResults->m_partition];
				else
					anchor_index = g_bc7_table_anchor_index_second_subset[pResults->m_partition];
			}

			anchor[k] = anchor_index;

			const uint32_t color_index_bits = get_bc7_color_index_size(best_mode, pResults->m_index_selector);
			const uint32_t num_color_indices = 1 << color_index_bits;

			if (color_selectors[anchor_index] & (num_color_indices >> 1))
			{
				for (uint32_t i = 0; i < 16; i++)
					if (pPartition[i] == k)
						color_selectors[i] = (uint8_t)((num_color_indices - 1) - color_selectors[i]);

				if (get_bc7_mode_has_seperate_alpha_selectors(best_mode))
				{
					for (uint32_t q = 0; q < 3; q++)
					{
						uint8_t t = low[k].m_c[q];
						low[k].m_c[q] = high[k].m_c[q];
						high[k].m_c[q] = t;
					}
				}
				else
				{
					color_quad_u8 tmp = low[k];
					low[k] = high[k];
					high[k] = tmp;
				}

				if (!g_bc7_mode_has_shared_p_bits[best_mode])
				{
					uint32_t t = pbits[k][0];
					pbits[k][0] = pbits[k][1];
					pbits[k][1] = t;
				}
			}

			if (get_bc7_mode_has_seperate_alpha_selectors(best_mode))
			{
				const uint32_t alpha_index_bits = get_bc7_alpha_index_size(best_mode, pResults->m_index_selector);
				const uint32_t num_alpha_indices = 1 << alpha_index_bits;

				if (alpha_selectors[anchor_index] & (num_alpha_indices >> 1))
				{
					for (uint32_t i = 0; i < 16; i++)
						if (pPartition[i] == k)
							alpha_selectors[i] = (uint8_t)((num_alpha_indices - 1) - alpha_selectors[i]);

					uint8_t t = low[k].m_c[3];
					low[k].m_c[3] = high[k].m_c[3];
					high[k].m_c[3] = t;
				}
			}
		}

		uint8_t* pBlock_bytes = (uint8_t*)(pBlock);
		memset(pBlock_bytes, 0, BC7ENC_BLOCK_SIZE);

		uint32_t cur_bit_ofs = 0;
		bc7_set_block_bits(pBlock_bytes, 1 << best_mode, best_mode + 1, &cur_bit_ofs);

		if ((best_mode == 4) || (best_mode == 5))
			bc7_set_block_bits(pBlock_bytes, pResults->m_rotation, 2, &cur_bit_ofs);

		if (best_mode == 4)
			bc7_set_block_bits(pBlock_bytes, pResults->m_index_selector, 1, &cur_bit_ofs);

		if (total_partitions > 1)
			bc7_set_block_bits(pBlock_bytes, pResults->m_partition, (total_partitions == 64) ? 6 : 4, &cur_bit_ofs);

		const uint32_t total_comps = (best_mode >= 4) ? 4 : 3;
		for (uint32_t comp = 0; comp < total_comps; comp++)
		{
			for (uint32_t subset = 0; subset < total_subsets; subset++)
			{
				bc7_set_block_bits(pBlock_bytes, low[subset].m_c[comp], (comp == 3) ? g_bc7_alpha_precision_table[best_mode] : g_bc7_color_precision_table[best_mode], &cur_bit_ofs);
				bc7_set_block_bits(pBlock_bytes, high[subset].m_c[comp], (comp == 3) ? g_bc7_alpha_precision_table[best_mode] : g_bc7_color_precision_table[best_mode], &cur_bit_ofs);
			}
		}

		if (g_bc7_mode_has_p_bits[best_mode])
		{
			for (uint32_t subset = 0; subset < total_subsets; subset++)
			{
				bc7_set_block_bits(pBlock_bytes, pbits[subset][0], 1, &cur_bit_ofs);
				if (!g_bc7_mode_has_shared_p_bits[best_mode])
					bc7_set_block_bits(pBlock_bytes, pbits[subset][1], 1, &cur_bit_ofs);
			}
		}

		for (uint32_t y = 0; y < 4; y++)
		{
			for (uint32_t x = 0; x < 4; x++)
			{
				int idx = x + y * 4;

				uint32_t n = pResults->m_index_selector ? get_bc7_alpha_index_size(best_mode, pResults->m_index_selector) : get_bc7_color_index_size(best_mode, pResults->m_index_selector);

				if ((idx == anchor[0]) || (idx == anchor[1]) || (idx == anchor[2]))
					n--;

				bc7_set_block_bits(pBlock_bytes, pResults->m_index_selector ? alpha_selectors[idx] : color_selectors[idx], n, &cur_bit_ofs);
			}
		}

		if (get_bc7_mode_has_seperate_alpha_selectors(best_mode))
		{
			for (uint32_t y = 0; y < 4; y++)
			{
				for (uint32_t x = 0; x < 4; x++)
				{
					int idx = x + y * 4;

					uint32_t n = pResults->m_index_selector ? get_bc7_color_index_size(best_mode, pResults->m_index_selector) : get_bc7_alpha_index_size(best_mode, pResults->m_index_selector);

					if ((idx == anchor[0]) || (idx == anchor[1]) || (idx == anchor[2]))
						n--;

					bc7_set_block_bits(pBlock_bytes, pResults->m_index_selector ? color_selectors[idx] : alpha_selectors[idx], n, &cur_bit_ofs);
				}
			}
		}

		assert(cur_bit_ofs == 128);
	}